

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O0

void __thiscall QPaintEngineEx::stroke(QPaintEngineEx *this,QVectorPath *path,QPen *inPen)

{
  double dVar1;
  ElementType EVar2;
  bool bVar3;
  PenStyle PVar4;
  int iVar5;
  PenCapStyle PVar6;
  PenJoinStyle PVar7;
  TransformationType TVar8;
  BrushStyle BVar9;
  QPaintEngineExPrivate *pQVar10;
  StrokeHandler *pSVar11;
  QPainterState *pQVar12;
  double *pdVar13;
  Promoted<long_long,_int> PVar14;
  const_reference a;
  qreal *pqVar15;
  qsizetype qVar16;
  ElementType *pEVar17;
  QTransform *this_00;
  QVectorPath *in_RSI;
  QPaintEngineEx *in_RDI;
  long in_FS_OFFSET;
  qreal dy;
  qreal qVar18;
  uint flags;
  qreal *lastPoint;
  int pointCount;
  qreal *points;
  ElementType *types;
  PenStyle style;
  qreal penWidth;
  int i;
  int patternSize;
  qreal patternLength;
  qreal extent;
  qreal pw;
  QTransform *xf;
  QPaintEngineExPrivate *d;
  QBrush brush;
  QVectorPath strokePath_1;
  QPointF p_1;
  QPointF p;
  QPointF pt_2;
  QPointF e;
  QPointF c2;
  QPointF c1;
  QPointF pt_1;
  QPointF pt;
  QPainterPath painterPath;
  QVectorPath strokePath;
  QList<double> pattern;
  QRectF extentRect;
  QRectF cpRect;
  QPen pen;
  QRectF clipRect;
  QColor color;
  QTransform xform;
  undefined4 in_stack_fffffffffffff918;
  PenCapStyle in_stack_fffffffffffff91c;
  QStroker *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  PenStyle in_stack_fffffffffffff92c;
  QStrokerOps *in_stack_fffffffffffff930;
  QStrokerOps *in_stack_fffffffffffff938;
  QRectF *in_stack_fffffffffffff940;
  QStrokerOps *in_stack_fffffffffffff948;
  QPainterPath *in_stack_fffffffffffff950;
  QTransform *in_stack_fffffffffffff958;
  QVectorPath *in_stack_fffffffffffff960;
  QRectF *in_stack_fffffffffffff9b0;
  QTransform *in_stack_fffffffffffff9b8;
  QPainterPath *in_stack_fffffffffffff9c0;
  QStrokerOps *in_stack_fffffffffffff9c8;
  QStrokerOps *in_stack_fffffffffffff9d8;
  QTransform *in_stack_fffffffffffff9e0;
  double local_558;
  uint local_534;
  qreal *local_520;
  ElementType *local_518;
  int local_500;
  double local_4f8;
  undefined1 *local_4b8;
  QVectorPath local_4b0;
  QPointF local_470;
  QPointF local_460;
  QPointF local_450;
  QPointF local_440;
  QPointF local_430;
  QPointF local_420;
  QPointF local_410;
  QPointF local_400;
  undefined1 *local_3e8;
  undefined1 local_3e0 [8];
  QVectorPath local_3d8;
  QColor local_380;
  double local_370;
  int local_364;
  qsizetype local_360;
  QList<double> local_358;
  qreal local_340;
  qreal local_338;
  undefined1 local_330 [32];
  QRectF local_310 [2];
  qreal local_2d0;
  qreal local_2c8;
  qreal local_2c0;
  qreal local_2b8;
  qreal local_2b0;
  qreal local_2a8;
  qreal local_2a0;
  qreal local_298;
  QRectF local_290;
  undefined1 *local_270;
  QRectF local_268;
  undefined1 *local_248;
  undefined1 *puStack_240;
  undefined1 local_198 [80];
  undefined1 local_148 [320];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = d_func((QPaintEngineEx *)0x585e09);
  bVar3 = QVectorPath::isEmpty(in_RSI);
  if (!bVar3) {
    if (pQVar10->strokeHandler == (StrokeHandler *)0x0) {
      pSVar11 = (StrokeHandler *)operator_new(0x30);
      QVectorPath::elementCount(in_RSI);
      StrokeHandler::StrokeHandler
                ((StrokeHandler *)in_stack_fffffffffffff920,in_stack_fffffffffffff91c);
      pQVar10->strokeHandler = pSVar11;
      QStrokerOps::setMoveToHook(&(pQVar10->stroker).super_QStrokerOps,qpaintengineex_moveTo);
      QStrokerOps::setLineToHook(&(pQVar10->stroker).super_QStrokerOps,qpaintengineex_lineTo);
      QStrokerOps::setCubicToHook(&(pQVar10->stroker).super_QStrokerOps,qpaintengineex_cubicTo);
    }
    local_268.xp = -NAN;
    local_268.yp = -NAN;
    local_268.w = -NAN;
    local_268.h = -NAN;
    QRectF::QRectF(&local_268);
    local_270 = &DAT_aaaaaaaaaaaaaaaa;
    QPen::QPen((QPen *)in_stack_fffffffffffff920,
               (QPen *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    PVar4 = QPen::style((QPen *)0x585f52);
    if (1 < (int)PVar4) {
      local_290.xp = -NAN;
      local_290.yp = -NAN;
      local_290.w = -NAN;
      local_290.h = -NAN;
      QVectorPath::controlPointRect((QVectorPath *)in_stack_fffffffffffff948);
      pQVar12 = state(in_RDI);
      bVar3 = QPen::isCosmetic((QPen *)in_stack_fffffffffffff920);
      if (bVar3) {
        QRectF::QRectF((QRectF *)in_stack_fffffffffffff930,
                       (QRect *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        local_268.xp = local_2b0;
        local_268.yp = local_2a8;
        local_268.w = local_2a0;
        local_268.h = local_298;
        qVar18 = QTransform::dx(&pQVar12->matrix);
        dy = QTransform::dy(&pQVar12->matrix);
        QRectF::translate(&local_290,qVar18,dy);
      }
      else {
        QTransform::inverted
                  ((QTransform *)in_stack_fffffffffffff948,(bool *)in_stack_fffffffffffff940);
        QRectF::QRectF((QRectF *)in_stack_fffffffffffff930,
                       (QRect *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        QTransform::mapRect(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
        local_268.xp = local_2d0;
        local_268.yp = local_2c8;
        local_268.w = local_2c0;
        local_268.h = local_2b8;
      }
      qVar18 = QPen::widthF((QPen *)0x58612b);
      if ((qVar18 != 0.0) || (NAN(qVar18))) {
        local_558 = QPen::widthF((QPen *)0x586145);
      }
      else {
        local_558 = 1.0;
      }
      local_310[0].xp = -NAN;
      local_310[0].yp = -NAN;
      local_310[0].w = -NAN;
      local_310[0].h = -NAN;
      QRectF::adjusted(in_stack_fffffffffffff940,(qreal)in_stack_fffffffffffff938,
                       (qreal)in_stack_fffffffffffff930,
                       (qreal)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                       (qreal)in_stack_fffffffffffff920);
      QRectF::operator&(local_310,(QRectF *)local_330);
      local_338 = QRectF::width(local_310);
      local_340 = QRectF::height(local_310);
      pdVar13 = qMax<double>(&local_338,&local_340);
      dVar1 = *pdVar13;
      local_4f8 = 0.0;
      local_358.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_358.d.ptr = (double *)&DAT_aaaaaaaaaaaaaaaa;
      local_358.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QPen::dashPattern((QPen *)in_stack_fffffffffffff948);
      local_360 = QList<double>::size(&local_358);
      local_364 = 0x20;
      PVar14 = qMin<long_long,int>(&local_360,&local_364);
      for (local_500 = 0; local_500 < (int)PVar14; local_500 = local_500 + 1) {
        a = QList<double>::at((QList<double> *)in_stack_fffffffffffff920,
                              CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
        local_370 = 0.0;
        pdVar13 = qMax<double>(a,&local_370);
        local_4f8 = *pdVar13 + local_4f8;
      }
      bVar3 = qFuzzyIsNull((double)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      if (bVar3) {
        QPen::setStyle((QPen *)in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
      }
      else {
        iVar5 = QDashStroker::repetitionLimit();
        if ((double)iVar5 < dVar1 / (local_558 * local_4f8)) {
          QPen::setStyle((QPen *)in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
          local_248 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_240 = &DAT_aaaaaaaaaaaaaaaa;
          local_380 = QPen::color((QPen *)CONCAT44(in_stack_fffffffffffff92c,
                                                   in_stack_fffffffffffff928));
          local_248 = (undefined1 *)local_380._0_8_;
          puStack_240._0_6_ = local_380.ct._4_6_;
          QColor::alpha((QColor *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
          QColor::setAlpha((QColor *)in_stack_fffffffffffff920,
                           (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
          QPen::setColor((QPen *)in_stack_fffffffffffff930,
                         (QColor *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        }
      }
      QList<double>::~QList((QList<double> *)0x5864b8);
    }
    bVar3 = qpen_fast_equals((QPen *)in_stack_fffffffffffff920,
                             (QPen *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    if (!bVar3) {
      QPen::operator=((QPen *)in_stack_fffffffffffff930,
                      (QPen *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      QPen::joinStyle((QPen *)0x58651b);
      QStroker::setJoinStyle(in_stack_fffffffffffff920,in_stack_fffffffffffff91c);
      QPen::capStyle((QPen *)0x58654d);
      QStroker::setCapStyle(in_stack_fffffffffffff920,in_stack_fffffffffffff91c);
      qVar18 = QPen::miterLimit((QPen *)0x58657f);
      QStroker::setMiterLimit(&pQVar10->stroker,qVar18);
      qVar18 = QPen::widthF((QPen *)0x586599);
      if ((qVar18 != 0.0) || (NAN(qVar18))) {
        QStroker::setStrokeWidth
                  (in_stack_fffffffffffff920,
                   (qfixed)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      }
      else {
        QStroker::setStrokeWidth
                  (in_stack_fffffffffffff920,
                   (qfixed)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
      }
      PVar4 = QPen::style((QPen *)0x5865fe);
      if (PVar4 == SolidLine) {
        pQVar10->activeStroker = &(pQVar10->stroker).super_QStrokerOps;
      }
      else if (PVar4 == NoPen) {
        pQVar10->activeStroker = (QStrokerOps *)0x0;
      }
      else {
        QPen::dashPattern((QPen *)in_stack_fffffffffffff948);
        QDashStroker::setDashPattern
                  ((QDashStroker *)in_stack_fffffffffffff920,
                   (QList<double> *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
        QList<double>::~QList((QList<double> *)0x5866a1);
        qVar18 = QPen::dashOffset((QPen *)0x5866c4);
        QDashStroker::setDashOffset(&pQVar10->dasher,qVar18);
        pQVar10->activeStroker = &(pQVar10->dasher).super_QStrokerOps;
      }
    }
    if (pQVar10->activeStroker != (QStrokerOps *)0x0) {
      bVar3 = QRectF::isNull(&local_268);
      if (!bVar3) {
        QStrokerOps::setClipRect(pQVar10->activeStroker,&local_268);
      }
      if ((QStroker *)pQVar10->activeStroker == &pQVar10->stroker) {
        bVar3 = QVectorPath::hasExplicitOpen(in_RSI);
        QStroker::setForceOpen(&pQVar10->stroker,bVar3);
      }
      local_518 = QVectorPath::elements(in_RSI);
      local_520 = QVectorPath::points(in_RSI);
      iVar5 = QVectorPath::elementCount(in_RSI);
      pqVar15 = local_520 + (iVar5 << 1);
      QDataBuffer<QPainterPath::ElementType>::reset(&pQVar10->strokeHandler->types);
      QDataBuffer<double>::reset(&pQVar10->strokeHandler->pts);
      local_534 = 0x2000;
      iVar5 = QVectorPath::elementCount(in_RSI);
      if (2 < iVar5) {
        local_534 = 0x2002;
      }
      PVar6 = QStroker::capStyle((QStroker *)0x58686a);
      if ((PVar6 == RoundCap) ||
         (PVar7 = QStroker::joinStyle((QStroker *)0x586883), PVar7 == RoundJoin)) {
        local_534 = local_534 | 4;
      }
      bVar3 = QPen::isCosmetic((QPen *)in_stack_fffffffffffff920);
      if (bVar3) {
        state(in_RDI);
        TVar8 = QTransform::type((QTransform *)
                                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        if ((int)TVar8 < 0x10) {
          QTransform::QTransform((QTransform *)in_stack_fffffffffffff920);
          QStrokerOps::setCurveThresholdFromTransform
                    (in_stack_fffffffffffff930,
                     (QTransform *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          (*pQVar10->activeStroker->_vptr_QStrokerOps[2])
                    (pQVar10->activeStroker,pQVar10->strokeHandler);
          if (local_518 == (ElementType *)0x0) {
            local_460.yp = -NAN;
            local_460.xp = -NAN;
            state(in_RDI);
            local_460 = ::operator*((QPointF *)in_stack_fffffffffffff920,
                                    (QTransform *)
                                    CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
            QPointF::x(&local_460);
            QPointF::y(&local_460);
            QStrokerOps::moveTo(in_stack_fffffffffffff938,(qfixed)in_stack_fffffffffffff930,
                                (qfixed)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928
                                                ));
            while (local_520 = local_520 + 2, local_520 < pqVar15) {
              local_470.yp = -NAN;
              local_470.xp = -NAN;
              state(in_RDI);
              local_470 = ::operator*((QPointF *)in_stack_fffffffffffff920,
                                      (QTransform *)
                                      CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918))
              ;
              QPointF::x(&local_470);
              QPointF::y(&local_470);
              QStrokerOps::lineTo((QStrokerOps *)
                                  CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                  (qfixed)in_stack_fffffffffffff920,
                                  (qfixed)CONCAT44(in_stack_fffffffffffff91c,
                                                   in_stack_fffffffffffff918));
            }
            bVar3 = QVectorPath::hasImplicitClose(in_RSI);
            if (bVar3) {
              in_stack_fffffffffffff930 = pQVar10->activeStroker;
              QPointF::x(&local_460);
              QPointF::y(&local_460);
              QStrokerOps::lineTo((QStrokerOps *)
                                  CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                  (qfixed)in_stack_fffffffffffff920,
                                  (qfixed)CONCAT44(in_stack_fffffffffffff91c,
                                                   in_stack_fffffffffffff918));
            }
          }
          else {
            while (local_520 < pqVar15) {
              EVar2 = *local_518;
              if (EVar2 == MoveToElement) {
                local_400.yp = -NAN;
                local_400.xp = -NAN;
                state(in_RDI);
                local_400 = ::operator*((QPointF *)in_stack_fffffffffffff920,
                                        (QTransform *)
                                        CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
                QPointF::x(&local_400);
                QPointF::y(&local_400);
                QStrokerOps::moveTo(in_stack_fffffffffffff938,(qfixed)in_stack_fffffffffffff930,
                                    (qfixed)CONCAT44(in_stack_fffffffffffff92c,
                                                     in_stack_fffffffffffff928));
                local_520 = local_520 + 2;
                local_518 = local_518 + 1;
              }
              else if (EVar2 == LineToElement) {
                local_410.yp = -NAN;
                local_410.xp = -NAN;
                state(in_RDI);
                local_410 = ::operator*((QPointF *)in_stack_fffffffffffff920,
                                        (QTransform *)
                                        CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
                in_stack_fffffffffffff9d8 = pQVar10->activeStroker;
                in_stack_fffffffffffff9e0 = (QTransform *)QPointF::x(&local_410);
                QPointF::y(&local_410);
                QStrokerOps::lineTo((QStrokerOps *)
                                    CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                    (qfixed)in_stack_fffffffffffff920,
                                    (qfixed)CONCAT44(in_stack_fffffffffffff91c,
                                                     in_stack_fffffffffffff918));
                local_520 = local_520 + 2;
                local_518 = local_518 + 1;
              }
              else if (EVar2 == CurveToElement) {
                local_420.yp = -NAN;
                local_420.xp = -NAN;
                state(in_RDI);
                local_420 = ::operator*((QPointF *)in_stack_fffffffffffff920,
                                        (QTransform *)
                                        CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
                local_430.yp = -NAN;
                local_430.xp = -NAN;
                state(in_RDI);
                local_430 = ::operator*((QPointF *)in_stack_fffffffffffff920,
                                        (QTransform *)
                                        CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
                local_440.yp = -NAN;
                local_440.xp = -NAN;
                state(in_RDI);
                local_440 = ::operator*((QPointF *)in_stack_fffffffffffff920,
                                        (QTransform *)
                                        CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
                QPointF::x(&local_420);
                QPointF::y(&local_420);
                QPointF::x(&local_430);
                QPointF::y(&local_430);
                QPointF::x(&local_440);
                QPointF::y(&local_440);
                QStrokerOps::cubicTo
                          (in_stack_fffffffffffff948,(qfixed)in_stack_fffffffffffff940,
                           (qfixed)in_stack_fffffffffffff938,(qfixed)in_stack_fffffffffffff930,
                           (qfixed)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                           (qfixed)in_stack_fffffffffffff920,
                           (qfixed)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
                local_520 = local_520 + 6;
                local_518 = local_518 + 3;
                local_534 = local_534 | 4;
              }
            }
            bVar3 = QVectorPath::hasImplicitClose(in_RSI);
            if (bVar3) {
              local_450.yp = -NAN;
              local_450.xp = -NAN;
              QVectorPath::points(in_RSI);
              state(in_RDI);
              local_450 = ::operator*((QPointF *)in_stack_fffffffffffff920,
                                      (QTransform *)
                                      CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918))
              ;
              QPointF::x(&local_450);
              QPointF::y(&local_450);
              QStrokerOps::lineTo((QStrokerOps *)
                                  CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                  (qfixed)in_stack_fffffffffffff920,
                                  (qfixed)CONCAT44(in_stack_fffffffffffff91c,
                                                   in_stack_fffffffffffff918));
            }
          }
          (*pQVar10->activeStroker->_vptr_QStrokerOps[3])();
        }
        else {
          local_3e8 = &DAT_aaaaaaaaaaaaaaaa;
          state(in_RDI);
          QVectorPath::convertToPainterPath(in_stack_fffffffffffff960);
          QTransform::map(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
          QPainterPath::~QPainterPath((QPainterPath *)0x586df5);
          QTransform::QTransform((QTransform *)in_stack_fffffffffffff920);
          QStrokerOps::strokePath
                    (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                     (QTransform *)in_stack_fffffffffffff9b0);
          QPainterPath::~QPainterPath((QPainterPath *)0x586e62);
        }
        memcpy(&local_4b0,&DAT_00bbe528,0x40);
        this_00 = (QTransform *)QDataBuffer<double>::data(&pQVar10->strokeHandler->pts);
        qVar16 = QDataBuffer<QPainterPath::ElementType>::size(&pQVar10->strokeHandler->types);
        iVar5 = (int)qVar16;
        pEVar17 = QDataBuffer<QPainterPath::ElementType>::data(&pQVar10->strokeHandler->types);
        QVectorPath::QVectorPath(&local_4b0,(qreal *)this_00,iVar5,pEVar17,local_534);
        memcpy(local_148,&DAT_00bbe568,0x50);
        pQVar12 = state(in_RDI);
        memcpy(local_148,&pQVar12->matrix,0x50);
        QTransform::QTransform(this_00);
        pQVar12 = state(in_RDI);
        memcpy(&pQVar12->matrix,local_198,0x4a);
        (*(in_RDI->super_QPaintEngine)._vptr_QPaintEngine[0x27])();
        local_4b8 = &DAT_aaaaaaaaaaaaaaaa;
        QPen::brush((QPen *)CONCAT44(iVar5,in_stack_fffffffffffff928));
        BVar9 = qbrush_style((QBrush *)0x58772e);
        if (BVar9 != SolidPattern) {
          QBrush::transform((QBrush *)this_00);
          QTransform::operator*(in_stack_fffffffffffff9e0,(QTransform *)in_stack_fffffffffffff9d8);
          QBrush::setTransform
                    ((QBrush *)in_stack_fffffffffffff930,
                     (QTransform *)CONCAT44(iVar5,in_stack_fffffffffffff928));
        }
        (*(in_RDI->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(in_RDI,&local_4b0,&local_4b8);
        pQVar12 = state(in_RDI);
        memcpy(&pQVar12->matrix,local_148,0x4a);
        (*(in_RDI->super_QPaintEngine)._vptr_QPaintEngine[0x27])();
        QBrush::~QBrush((QBrush *)0x5877e2);
        QVectorPath::~QVectorPath((QVectorPath *)in_stack_fffffffffffff930);
      }
      else {
        state(in_RDI);
        QStrokerOps::setCurveThresholdFromTransform
                  (in_stack_fffffffffffff930,
                   (QTransform *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        (*pQVar10->activeStroker->_vptr_QStrokerOps[2])
                  (pQVar10->activeStroker,pQVar10->strokeHandler);
        if (local_518 == (ElementType *)0x0) {
          QStrokerOps::moveTo(in_stack_fffffffffffff938,(qfixed)in_stack_fffffffffffff930,
                              (qfixed)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928))
          ;
          while (local_520 = local_520 + 2, local_520 < pqVar15) {
            QStrokerOps::lineTo((QStrokerOps *)
                                CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                (qfixed)in_stack_fffffffffffff920,
                                (qfixed)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
          }
          bVar3 = QVectorPath::hasImplicitClose(in_RSI);
          if (bVar3) {
            QVectorPath::points(in_RSI);
            QVectorPath::points(in_RSI);
            QStrokerOps::lineTo((QStrokerOps *)
                                CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                (qfixed)in_stack_fffffffffffff920,
                                (qfixed)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
          }
        }
        else {
          while (local_520 < pqVar15) {
            EVar2 = *local_518;
            if (EVar2 == MoveToElement) {
              QStrokerOps::moveTo(in_stack_fffffffffffff938,(qfixed)in_stack_fffffffffffff930,
                                  (qfixed)CONCAT44(in_stack_fffffffffffff92c,
                                                   in_stack_fffffffffffff928));
              local_520 = local_520 + 2;
              local_518 = local_518 + 1;
            }
            else if (EVar2 == LineToElement) {
              QStrokerOps::lineTo((QStrokerOps *)
                                  CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                  (qfixed)in_stack_fffffffffffff920,
                                  (qfixed)CONCAT44(in_stack_fffffffffffff91c,
                                                   in_stack_fffffffffffff918));
              local_520 = local_520 + 2;
              local_518 = local_518 + 1;
            }
            else if (EVar2 == CurveToElement) {
              QStrokerOps::cubicTo
                        (in_stack_fffffffffffff948,(qfixed)in_stack_fffffffffffff940,
                         (qfixed)in_stack_fffffffffffff938,(qfixed)in_stack_fffffffffffff930,
                         (qfixed)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         (qfixed)in_stack_fffffffffffff920,
                         (qfixed)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
              local_520 = local_520 + 6;
              local_518 = local_518 + 3;
              local_534 = local_534 | 4;
            }
          }
          bVar3 = QVectorPath::hasImplicitClose(in_RSI);
          if (bVar3) {
            QVectorPath::points(in_RSI);
            QVectorPath::points(in_RSI);
            QStrokerOps::lineTo((QStrokerOps *)
                                CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                (qfixed)in_stack_fffffffffffff920,
                                (qfixed)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ));
          }
        }
        (*pQVar10->activeStroker->_vptr_QStrokerOps[3])();
        qVar16 = QDataBuffer<QPainterPath::ElementType>::size(&pQVar10->strokeHandler->types);
        if (qVar16 != 0) {
          memcpy(&local_3d8,&DAT_00bbe4e8,0x40);
          pdVar13 = QDataBuffer<double>::data(&pQVar10->strokeHandler->pts);
          qVar16 = QDataBuffer<QPainterPath::ElementType>::size(&pQVar10->strokeHandler->types);
          pEVar17 = QDataBuffer<QPainterPath::ElementType>::data(&pQVar10->strokeHandler->types);
          QVectorPath::QVectorPath(&local_3d8,pdVar13,(int)qVar16,pEVar17,local_534);
          QPen::brush((QPen *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          (*(in_RDI->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(in_RDI,&local_3d8,local_3e0);
          QBrush::~QBrush((QBrush *)0x586d55);
          QVectorPath::~QVectorPath((QVectorPath *)in_stack_fffffffffffff930);
        }
      }
    }
    QPen::~QPen((QPen *)0x587807);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPaintEngineEx::stroke(const QVectorPath &path, const QPen &inPen)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QPaintEngineEx::stroke()" << inPen;
#endif

    Q_D(QPaintEngineEx);

    if (path.isEmpty())
        return;

    if (!d->strokeHandler) {
        d->strokeHandler = new StrokeHandler(path.elementCount()+4);
        d->stroker.setMoveToHook(qpaintengineex_moveTo);
        d->stroker.setLineToHook(qpaintengineex_lineTo);
        d->stroker.setCubicToHook(qpaintengineex_cubicTo);
    }

    QRectF clipRect;
    QPen pen = inPen;
    if (pen.style() > Qt::SolidLine) {
        QRectF cpRect = path.controlPointRect();
        const QTransform &xf = state()->matrix;
        if (pen.isCosmetic()) {
            clipRect = d->exDeviceRect;
            cpRect.translate(xf.dx(), xf.dy());
        } else {
            clipRect = xf.inverted().mapRect(QRectF(d->exDeviceRect));
        }
        // Check to avoid generating unwieldy amount of dashes that will not be visible anyway
        qreal pw = pen.widthF() ? pen.widthF() : 1;
        QRectF extentRect = cpRect.adjusted(-pw, -pw, pw, pw) & clipRect;
        qreal extent = qMax(extentRect.width(), extentRect.height());
        qreal patternLength = 0;
        const QList<qreal> pattern = pen.dashPattern();
        const int patternSize = qMin(pattern.size(), 32);
        for (int i = 0; i < patternSize; i++)
            patternLength += qMax(pattern.at(i), qreal(0));
        patternLength *= pw;
        if (qFuzzyIsNull(patternLength)) {
            pen.setStyle(Qt::NoPen);
        } else if (extent / patternLength > QDashStroker::repetitionLimit()) {
            // approximate stream of tiny dashes with semi-transparent solid line
            pen.setStyle(Qt::SolidLine);
            QColor color(pen.color());
            color.setAlpha(color.alpha() / 2);
            pen.setColor(color);
        }
    }

    if (!qpen_fast_equals(pen, d->strokerPen)) {
        d->strokerPen = pen;
        d->stroker.setJoinStyle(pen.joinStyle());
        d->stroker.setCapStyle(pen.capStyle());
        d->stroker.setMiterLimit(pen.miterLimit());
        qreal penWidth = pen.widthF();
        if (penWidth == 0)
            d->stroker.setStrokeWidth(1);
        else
            d->stroker.setStrokeWidth(penWidth);

        Qt::PenStyle style = pen.style();
        if (style == Qt::SolidLine) {
            d->activeStroker = &d->stroker;
        } else if (style == Qt::NoPen) {
            d->activeStroker = nullptr;
        } else {
            d->dasher.setDashPattern(pen.dashPattern());
            d->dasher.setDashOffset(pen.dashOffset());
            d->activeStroker = &d->dasher;
        }
    }

    if (!d->activeStroker) {
        return;
    }

    if (!clipRect.isNull())
        d->activeStroker->setClipRect(clipRect);

    if (d->activeStroker == &d->stroker)
        d->stroker.setForceOpen(path.hasExplicitOpen());

    const QPainterPath::ElementType *types = path.elements();
    const qreal *points = path.points();
    int pointCount = path.elementCount();

    const qreal *lastPoint = points + (pointCount<<1);

    d->strokeHandler->types.reset();
    d->strokeHandler->pts.reset();

    // Some engines might decide to optimize for the non-shape hint later on...
    uint flags = QVectorPath::WindingFill;

    if (path.elementCount() > 2)
        flags |= QVectorPath::NonConvexShapeMask;

    if (d->stroker.capStyle() == Qt::RoundCap || d->stroker.joinStyle() == Qt::RoundJoin)
        flags |= QVectorPath::CurvedShapeMask;

    // ### Perspective Xforms are currently not supported...
    if (!pen.isCosmetic()) {
        // We include cosmetic pens in this case to avoid having to
        // change the current transform. Normal transformed,
        // non-cosmetic pens will be transformed as part of fill
        // later, so they are also covered here..
        d->activeStroker->setCurveThresholdFromTransform(state()->matrix);
        d->activeStroker->begin(d->strokeHandler);
        if (types) {
            while (points < lastPoint) {
                switch (*types) {
                case QPainterPath::MoveToElement:
                    d->activeStroker->moveTo(points[0], points[1]);
                    points += 2;
                    ++types;
                    break;
                case QPainterPath::LineToElement:
                    d->activeStroker->lineTo(points[0], points[1]);
                    points += 2;
                    ++types;
                    break;
                case QPainterPath::CurveToElement:
                    d->activeStroker->cubicTo(points[0], points[1],
                                              points[2], points[3],
                                              points[4], points[5]);
                    points += 6;
                    types += 3;
                    flags |= QVectorPath::CurvedShapeMask;
                    break;
                default:
                    break;
                }
            }
            if (path.hasImplicitClose())
                d->activeStroker->lineTo(path.points()[0], path.points()[1]);

        } else {
            d->activeStroker->moveTo(points[0], points[1]);
            points += 2;
            while (points < lastPoint) {
                d->activeStroker->lineTo(points[0], points[1]);
                points += 2;
            }
            if (path.hasImplicitClose())
                d->activeStroker->lineTo(path.points()[0], path.points()[1]);
        }
        d->activeStroker->end();

        if (!d->strokeHandler->types.size()) // an empty path...
            return;

        QVectorPath strokePath(d->strokeHandler->pts.data(),
                               d->strokeHandler->types.size(),
                               d->strokeHandler->types.data(),
                               flags);
        fill(strokePath, pen.brush());
    } else {
        // For cosmetic pens we need a bit of trickery... We to process xform the input points
        if (state()->matrix.type() >= QTransform::TxProject) {
            QPainterPath painterPath = state()->matrix.map(path.convertToPainterPath());
            d->activeStroker->strokePath(painterPath, d->strokeHandler, QTransform());
        } else {
            d->activeStroker->setCurveThresholdFromTransform(QTransform());
            d->activeStroker->begin(d->strokeHandler);
            if (types) {
                while (points < lastPoint) {
                    switch (*types) {
                    case QPainterPath::MoveToElement: {
                        QPointF pt = (*(const QPointF *) points) * state()->matrix;
                        d->activeStroker->moveTo(pt.x(), pt.y());
                        points += 2;
                        ++types;
                        break;
                    }
                    case QPainterPath::LineToElement: {
                        QPointF pt = (*(const QPointF *) points) * state()->matrix;
                        d->activeStroker->lineTo(pt.x(), pt.y());
                        points += 2;
                        ++types;
                        break;
                    }
                    case QPainterPath::CurveToElement: {
                        QPointF c1 = ((const QPointF *) points)[0] * state()->matrix;
                        QPointF c2 = ((const QPointF *) points)[1] * state()->matrix;
                        QPointF e =  ((const QPointF *) points)[2] * state()->matrix;
                        d->activeStroker->cubicTo(c1.x(), c1.y(), c2.x(), c2.y(), e.x(), e.y());
                        points += 6;
                        types += 3;
                        flags |= QVectorPath::CurvedShapeMask;
                        break;
                    }
                    default:
                        break;
                    }
                }
                if (path.hasImplicitClose()) {
                    QPointF pt = * ((const QPointF *) path.points()) * state()->matrix;
                    d->activeStroker->lineTo(pt.x(), pt.y());
                }

            } else {
                QPointF p = ((const QPointF *)points)[0] * state()->matrix;
                d->activeStroker->moveTo(p.x(), p.y());
                points += 2;
                while (points < lastPoint) {
                    QPointF p = ((const QPointF *)points)[0] * state()->matrix;
                    d->activeStroker->lineTo(p.x(), p.y());
                    points += 2;
                }
                if (path.hasImplicitClose())
                    d->activeStroker->lineTo(p.x(), p.y());
            }
            d->activeStroker->end();
        }

        QVectorPath strokePath(d->strokeHandler->pts.data(),
                               d->strokeHandler->types.size(),
                               d->strokeHandler->types.data(),
                               flags);

        QTransform xform = state()->matrix;
        state()->matrix = QTransform();
        transformChanged();

        QBrush brush = pen.brush();
        if (qbrush_style(brush) != Qt::SolidPattern)
            brush.setTransform(brush.transform() * xform);

        fill(strokePath, brush);

        state()->matrix = xform;
        transformChanged();
    }
}